

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

JointIndex __thiscall iDynTree::Model::getJointIndex(Model *this,string *jointName)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  char *pcVar4;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  stringstream ss;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *local_18;
  JointIndex local_8;
  
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_18 = in_RSI;
  while( true ) {
    __rhs = local_20;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             getNrOfJoints((Model *)0x449517);
    if (pbVar2 <= __rhs) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar3 = std::operator<<(local_198,"jointName ");
      poVar3 = std::operator<<(poVar3,local_18);
      std::operator<<(poVar3," not found in the model.");
      std::__cxx11::stringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("Model","getJointIndex",pcVar4);
      std::__cxx11::string::~string(local_1d8);
      local_8 = JOINT_INVALID_INDEX;
      std::__cxx11::stringstream::~stringstream(local_1a8);
      return local_8;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 4),(size_type)local_20);
    _Var1 = std::operator==(in_RDI,__rhs);
    if (_Var1) break;
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_20->field_0x1;
  }
  return (JointIndex)local_20;
}

Assistant:

JointIndex Model::getJointIndex(const std::string& jointName) const
{
    for(size_t i=0; i < this->getNrOfJoints(); i++ )
    {
        if( jointName == jointNames[i] )
        {
            return i;
        }
    }

    std::stringstream ss;
    ss << "jointName " << jointName << " not found in the model.";
    reportError("Model","getJointIndex",ss.str().c_str());

    return JOINT_INVALID_INDEX;
}